

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConfigureFileCommand.h
# Opt level: O2

void __thiscall cmConfigureFileCommand::~cmConfigureFileCommand(cmConfigureFileCommand *this)

{
  ~cmConfigureFileCommand(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmConfigureFileCommand; }